

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O1

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::CovergroupType>
          (ASTSerializer *this,CovergroupType *elem,bool inMembersArray)

{
  flat_hash_set<const_void_*> *arrays_;
  size_t *psVar1;
  group_type_pointer pgVar2;
  byte bVar3;
  byte bVar4;
  undefined4 uVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppvVar7;
  char *__s;
  SourceManager *this_00;
  JsonWriter *pJVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  size_t sVar11;
  ulong uVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  group_type_pointer pgVar16;
  ulong hash;
  ulong uVar17;
  value_type *elements;
  long lVar18;
  ulong uVar19;
  Symbol *member;
  Symbol *this_01;
  uint uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  string_view sVar28;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar29;
  string_view name;
  string_view name_00;
  string_view value;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view value_00;
  locator res;
  string local_70;
  CovergroupType *local_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  if (inMembersArray || this->detailedTypeInfo != false) {
    arrays_ = &this->visiting;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = elem;
    hash = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar12 = hash >> ((byte)(this->visiting).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                            .arrays.groups_size_index & 0x3f);
    pgVar6 = (this->visiting).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
             .arrays.groups_;
    uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppvVar7 = (this->visiting).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
              .arrays.elements_;
    local_48 = (this->visiting).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
               .arrays.groups_size_mask;
    uVar17 = 0;
    uVar19 = uVar12;
    do {
      pgVar16 = pgVar6 + uVar19;
      uVar24 = (uchar)uVar5;
      auVar22[0] = -(pgVar16->m[0].n == uVar24);
      uVar25 = (uchar)((uint)uVar5 >> 8);
      auVar22[1] = -(pgVar16->m[1].n == uVar25);
      uVar26 = (uchar)((uint)uVar5 >> 0x10);
      auVar22[2] = -(pgVar16->m[2].n == uVar26);
      uVar27 = (uchar)((uint)uVar5 >> 0x18);
      auVar22[3] = -(pgVar16->m[3].n == uVar27);
      auVar22[4] = -(pgVar16->m[4].n == uVar24);
      auVar22[5] = -(pgVar16->m[5].n == uVar25);
      auVar22[6] = -(pgVar16->m[6].n == uVar26);
      auVar22[7] = -(pgVar16->m[7].n == uVar27);
      auVar22[8] = -(pgVar16->m[8].n == uVar24);
      auVar22[9] = -(pgVar16->m[9].n == uVar25);
      auVar22[10] = -(pgVar16->m[10].n == uVar26);
      auVar22[0xb] = -(pgVar16->m[0xb].n == uVar27);
      auVar22[0xc] = -(pgVar16->m[0xc].n == uVar24);
      auVar22[0xd] = -(pgVar16->m[0xd].n == uVar25);
      auVar22[0xe] = -(pgVar16->m[0xe].n == uVar26);
      auVar22[0xf] = -(pgVar16->m[0xf].n == uVar27);
      for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe); uVar20 != 0;
          uVar20 = uVar20 - 1 & uVar20) {
        uVar9 = 0;
        if (uVar20 != 0) {
          for (; (uVar20 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
          }
        }
        if ((CovergroupType *)ppvVar7[uVar19 * 0xf + (ulong)uVar9] == elem) {
          bVar21 = ppvVar7 + uVar19 * 0xf + (ulong)uVar9 == (value_type_pointer)0x0;
          goto LAB_00343d41;
        }
      }
      bVar21 = true;
      if ((pgVar6[uVar19].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      lVar18 = uVar19 + uVar17;
      uVar17 = uVar17 + 1;
      uVar19 = lVar18 + 1U & local_48;
    } while (uVar17 <= local_48);
LAB_00343d41:
    local_50 = elem;
    if (bVar21) {
      local_48 = CONCAT44(uVar5,uVar5);
      uStack_40 = uVar5;
      uStack_3c = uVar5;
      if ((this->visiting).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
          .size_ctrl.size <
          (this->visiting).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
        ::nosize_unchecked_emplace_at<void_const*>
                  ((locator *)&local_70,
                   (table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                    *)arrays_,(arrays_type *)arrays_,uVar12,hash,&local_50);
        psVar1 = &(this->visiting).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
        ::unchecked_emplace_with_rehash<void_const*>
                  ((locator *)&local_70,
                   (table_core<boost::unordered::detail::foa::flat_set_types<void_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<void_const*>>
                    *)arrays_,hash,&local_50);
      }
      if (bVar21) {
        if ((elem->super_Type).super_Symbol.kind == TransparentMember) {
          return;
        }
        JsonWriter::startObject(this->writer);
        sVar28 = (elem->super_Type).super_Symbol.name;
        name._M_str = "name";
        name._M_len = 4;
        JsonWriter::writeProperty(this->writer,name);
        JsonWriter::writeValue(this->writer,sVar28);
        __s = *(char **)(toString(slang::ast::SymbolKind)::strings +
                        (long)(int)(elem->super_Type).super_Symbol.kind * 8);
        sVar13 = strlen(__s);
        name_00._M_str = "kind";
        name_00._M_len = 4;
        JsonWriter::writeProperty(this->writer,name_00);
        value._M_str = __s;
        value._M_len = sVar13;
        JsonWriter::writeValue(this->writer,value);
        if ((this->includeSourceInfo == true) &&
           (this_00 = this->compilation->sourceManager, this_00 != (SourceManager *)0x0)) {
          sVar28 = SourceManager::getFileName(this_00,(elem->super_Type).super_Symbol.location);
          name_01._M_str = "source_file";
          name_01._M_len = 0xb;
          JsonWriter::writeProperty(this->writer,name_01);
          JsonWriter::writeValue(this->writer,sVar28);
          sVar14 = SourceManager::getLineNumber(this_00,(elem->super_Type).super_Symbol.location);
          name_02._M_str = "source_line";
          name_02._M_len = 0xb;
          JsonWriter::writeProperty(this->writer,name_02);
          JsonWriter::writeValue(this->writer,sVar14);
          sVar14 = SourceManager::getColumnNumber(this_00,(elem->super_Type).super_Symbol.location);
          name_03._M_str = "source_column";
          name_03._M_len = 0xd;
          JsonWriter::writeProperty(this->writer,name_03);
          JsonWriter::writeValue(this->writer,sVar14);
        }
        if (this->includeAddrs == true) {
          name_04._M_str = "addr";
          name_04._M_len = 4;
          JsonWriter::writeProperty(this->writer,name_04);
          JsonWriter::writeValue(this->writer,(uint64_t)elem);
        }
        sVar29 = Compilation::getAttributes(this->compilation,(Symbol *)elem);
        if (sVar29._M_extent._M_extent_value._M_extent_value != 0) {
          name_05._M_str = "attributes";
          name_05._M_len = 10;
          JsonWriter::writeProperty(this->writer,name_05);
          JsonWriter::startArray(this->writer);
          lVar18 = 0;
          do {
            local_70._M_dataplus._M_p._0_1_ = 0;
            Symbol::visit<slang::ast::ASTSerializer&,bool&>
                      (*(Symbol **)((long)sVar29._M_ptr + lVar18),this,(bool *)&local_70);
            lVar18 = lVar18 + 8;
          } while (sVar29._M_extent._M_extent_value._M_extent_value << 3 != lVar18);
          JsonWriter::endArray(this->writer);
        }
        if ((elem->super_Scope).deferredMemberIndex != Invalid) {
          Scope::elaborate(&elem->super_Scope);
        }
        if ((elem->super_Scope).firstMember != (Symbol *)0x0) {
          name_06._M_str = "members";
          name_06._M_len = 7;
          JsonWriter::writeProperty(this->writer,name_06);
          JsonWriter::startArray(this->writer);
          if ((elem->super_Scope).deferredMemberIndex != Invalid) {
            Scope::elaborate(&elem->super_Scope);
          }
          this_01 = (elem->super_Scope).firstMember;
          if (this_01 != (Symbol *)0x0) {
            do {
              local_70._M_dataplus._M_p._0_1_ = 1;
              Symbol::visit<slang::ast::ASTSerializer&,bool&>(this_01,this,(bool *)&local_70);
              this_01 = this_01->nextInScope;
            } while (this_01 != (Symbol *)0x0);
          }
          JsonWriter::endArray(this->writer);
        }
        CovergroupType::serializeTo(elem,this);
        JsonWriter::endObject(this->writer);
        uVar12 = hash >> ((byte)(this->visiting).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                                .arrays.groups_size_index & 0x3f);
        pgVar6 = (this->visiting).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                 .arrays.groups_;
        ppvVar7 = (this->visiting).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                  .arrays.elements_;
        uVar19 = (this->visiting).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                 .arrays.groups_size_mask;
        uVar17 = 0;
        do {
          pgVar16 = pgVar6 + uVar12;
          pgVar2 = pgVar6 + uVar12;
          auVar23[0] = -(pgVar2->m[0].n == (uchar)local_48);
          auVar23[1] = -(pgVar2->m[1].n == local_48._1_1_);
          auVar23[2] = -(pgVar2->m[2].n == local_48._2_1_);
          auVar23[3] = -(pgVar2->m[3].n == local_48._3_1_);
          auVar23[4] = -(pgVar2->m[4].n == local_48._4_1_);
          auVar23[5] = -(pgVar2->m[5].n == local_48._5_1_);
          auVar23[6] = -(pgVar2->m[6].n == local_48._6_1_);
          auVar23[7] = -(pgVar2->m[7].n == local_48._7_1_);
          auVar23[8] = -(pgVar2->m[8].n == (uchar)uStack_40);
          auVar23[9] = -(pgVar2->m[9].n == uStack_40._1_1_);
          auVar23[10] = -(pgVar2->m[10].n == uStack_40._2_1_);
          auVar23[0xb] = -(pgVar2->m[0xb].n == uStack_40._3_1_);
          auVar23[0xc] = -(pgVar2->m[0xc].n == (uchar)uStack_3c);
          auVar23[0xd] = -(pgVar2->m[0xd].n == uStack_3c._1_1_);
          auVar23[0xe] = -(pgVar2->m[0xe].n == uStack_3c._2_1_);
          auVar23[0xf] = -(pgVar2->m[0xf].n == uStack_3c._3_1_);
          for (uVar20 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe); uVar20 != 0;
              uVar20 = uVar20 - 1 & uVar20) {
            uVar9 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
              }
            }
            uVar15 = (ulong)uVar9;
            if ((CovergroupType *)ppvVar7[uVar12 * 0xf + uVar15] == elem) {
              bVar21 = ppvVar7 + uVar12 * 0xf + uVar15 == (value_type_pointer)0x0;
              goto LAB_003440fb;
            }
          }
          bVar21 = true;
          if ((pgVar16->m[0xf].n &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
          lVar18 = uVar12 + uVar17;
          uVar17 = uVar17 + 1;
          uVar12 = lVar18 + 1U & uVar19;
        } while (uVar17 <= uVar19);
        pgVar16 = (group_type_pointer)0x0;
        uVar15 = 0;
LAB_003440fb:
        if (bVar21) {
          return;
        }
        bVar3 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[pgVar16->m[uVar15].n & 7];
        bVar4 = *(byte *)((ulong)(pgVar16->m + uVar15) | 0xf);
        pgVar16->m[uVar15].n = '\0';
        sVar11 = (this->visiting).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
                 .size_ctrl.size;
        (this->visiting).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
        .size_ctrl.ml =
             (this->visiting).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
             .size_ctrl.ml - (ulong)((bVar3 & bVar4) != 0);
        (this->visiting).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_void_*>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<const_void_*>_>
        .size_ctrl.size = sVar11 - 1;
        return;
      }
    }
    pJVar8 = this->writer;
    Type::toString_abi_cxx11_(&local_70,&elem->super_Type);
    value_00._M_str._1_7_ = local_70._M_dataplus._M_p._1_7_;
    value_00._M_str._0_1_ = local_70._M_dataplus._M_p._0_1_;
    value_00._M_len = local_70._M_string_length;
    JsonWriter::writeValue(pJVar8,value_00);
  }
  else {
    pJVar8 = this->writer;
    Type::toString_abi_cxx11_(&local_70,&elem->super_Type);
    sVar28._M_str._1_7_ = local_70._M_dataplus._M_p._1_7_;
    sVar28._M_str._0_1_ = local_70._M_dataplus._M_p._0_1_;
    sVar28._M_len = local_70._M_string_length;
    JsonWriter::writeValue(pJVar8,sVar28);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_) !=
      &local_70.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_70._M_dataplus._M_p._1_7_,local_70._M_dataplus._M_p._0_1_),
                    local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}